

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

lzma_ret lzma_index_append(lzma_index *i,lzma_allocator *allocator,lzma_vli unpadded_size,
                          lzma_vli uncompressed_size)

{
  index_tree_node *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  lzma_vli lVar4;
  long lVar5;
  index_tree_node *node;
  index_tree_node *piVar6;
  lzma_ret lVar7;
  ulong uVar8;
  lzma_vli lVar9;
  index_tree_node *local_70;
  
  lVar7 = LZMA_PROG_ERROR;
  if (((-1 < (long)uncompressed_size) && (i != (lzma_index *)0x0)) &&
     (0x8000000000000007 < unpadded_size + 0x8000000000000003)) {
    piVar1 = (i->streams).rightmost;
    node = piVar1[1].right;
    if (node == (index_tree_node *)0x0) {
      lVar9 = 0;
      local_70 = (index_tree_node *)0x0;
    }
    else {
      if ((long)(&node[1].right)[(long)node[1].parent * 2] < 0) goto LAB_005c044a;
      lVar9 = (ulong)((long)&(&node[1].right)[(long)node[1].parent * 2]->uncompressed_base + 3U) &
              0xfffffffffffffffc;
      local_70 = (&node[1].left)[(long)node[1].parent * 2];
    }
    uVar2 = lzma_vli_size(unpadded_size);
    uVar3 = lzma_vli_size(uncompressed_size);
    uVar8 = (ulong)(uVar3 + uVar2);
    lVar4 = index_file_size(piVar1->compressed_base,unpadded_size + lVar9,
                            piVar1[2].compressed_base + 1,
                            (long)&(piVar1[2].parent)->uncompressed_base + uVar8,
                            piVar1[4].uncompressed_base);
    lVar7 = LZMA_DATA_ERROR;
    if (lVar4 != 0xffffffffffffffff) {
      lVar4 = i->index_list_size;
      uVar2 = lzma_vli_size(i->record_count + 1);
      lVar5 = (ulong)(uVar2 + 1) + lVar4 + uVar8;
      if (lVar5 + 4 < 0) {
LAB_005c044a:
        __assert_fail("vli <= LZMA_VLI_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                      ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
      }
      if ((lVar5 + 7U & 0xfffffffffffffffc) < 0x400000001) {
        if ((node == (index_tree_node *)0x0) ||
           (piVar6 = (index_tree_node *)((long)&(node[1].parent)->uncompressed_base + 1),
           (index_tree_node *)node[1].compressed_base <= piVar6)) {
          node = (index_tree_node *)lzma_alloc(i->prealloc * 0x10 + 0x40,allocator);
          if (node == (index_tree_node *)0x0) {
            return LZMA_MEM_ERROR;
          }
          node[1].parent = (index_tree_node *)0x0;
          node[1].compressed_base = i->prealloc;
          i->prealloc = 0x200;
          node->uncompressed_base = (lzma_vli)local_70;
          node->compressed_base = lVar9;
          node[1].uncompressed_base = piVar1[2].compressed_base + 1;
          index_tree_append((index_tree *)&piVar1[1].parent,node);
          piVar6 = node[1].parent;
        }
        else {
          node[1].parent = piVar6;
        }
        (&node[1].left)[(long)piVar6 * 2] =
             (index_tree_node *)((long)&local_70->uncompressed_base + uncompressed_size);
        (&node[1].right)[(long)piVar6 * 2] = (index_tree_node *)(unpadded_size + lVar9);
        piVar1[2].compressed_base = piVar1[2].compressed_base + 1;
        piVar1[2].parent = (index_tree_node *)((long)&(piVar1[2].parent)->uncompressed_base + uVar8)
        ;
        i->uncompressed_size = i->uncompressed_size + uncompressed_size;
        i->total_size = (unpadded_size + 3 & 0x7ffffffffffffffc) + i->total_size;
        i->record_count = i->record_count + 1;
        i->index_list_size = i->index_list_size + uVar8;
        lVar7 = LZMA_OK;
      }
    }
  }
  return lVar7;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_append(lzma_index *i, lzma_allocator *allocator,
		lzma_vli unpadded_size, lzma_vli uncompressed_size)
{
	index_stream *s;
	index_group *g;
	lzma_vli compressed_base;
	lzma_vli uncompressed_base;
	uint32_t index_list_size_add;

	// Validate.
	if (i == NULL || unpadded_size < UNPADDED_SIZE_MIN
			|| unpadded_size > UNPADDED_SIZE_MAX
			|| uncompressed_size > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	s = (index_stream *)(i->streams.rightmost);
	g = (index_group *)(s->groups.rightmost);

	compressed_base = g == NULL ? 0
			: vli_ceil4(g->records[g->last].unpadded_sum);
	uncompressed_base = g == NULL ? 0
			: g->records[g->last].uncompressed_sum;
	index_list_size_add = lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);

	// Check that the file size will stay within limits.
	if (index_file_size(s->node.compressed_base,
			compressed_base + unpadded_size, s->record_count + 1,
			s->index_list_size + index_list_size_add,
			s->stream_padding) == LZMA_VLI_UNKNOWN)
		return LZMA_DATA_ERROR;

	// The size of the Index field must not exceed the maximum value
	// that can be stored in the Backward Size field.
	if (index_size(i->record_count + 1,
			i->index_list_size + index_list_size_add)
			> LZMA_BACKWARD_SIZE_MAX)
		return LZMA_DATA_ERROR;

	if (g != NULL && g->last + 1 < g->allocated) {
		// There is space in the last group at least for one Record.
		++g->last;
	} else {
		// We need to allocate a new group.
		g = lzma_alloc(sizeof(index_group)
				+ i->prealloc * sizeof(index_record),
				allocator);
		if (g == NULL)
			return LZMA_MEM_ERROR;

		g->last = 0;
		g->allocated = i->prealloc;

		// Reset prealloc so that if the application happens to
		// add new Records, the allocation size will be sane.
		i->prealloc = INDEX_GROUP_SIZE;

		// Set the start offsets of this group.
		g->node.uncompressed_base = uncompressed_base;
		g->node.compressed_base = compressed_base;
		g->number_base = s->record_count + 1;

		// Add the new group to the Stream.
		index_tree_append(&s->groups, &g->node);
	}

	// Add the new Record to the group.
	g->records[g->last].uncompressed_sum
			= uncompressed_base + uncompressed_size;
	g->records[g->last].unpadded_sum
			= compressed_base + unpadded_size;

	// Update the totals.
	++s->record_count;
	s->index_list_size += index_list_size_add;

	i->total_size += vli_ceil4(unpadded_size);
	i->uncompressed_size += uncompressed_size;
	++i->record_count;
	i->index_list_size += index_list_size_add;

	return LZMA_OK;
}